

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O3

size_t __thiscall
asio::detail::epoll_reactor::
cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,size_t max_cancelled)

{
  size_t sVar1;
  bool bVar2;
  op_queue<asio::detail::scheduler_operation> ops;
  op_queue<asio::detail::scheduler_operation> local_38;
  
  bVar2 = (this->mutex_).enabled_ == true;
  if (bVar2) {
    pthread_mutex_lock((pthread_mutex_t *)&(this->mutex_).mutex_);
  }
  local_38.front_ = (scheduler_operation *)0x0;
  local_38.back_ = (scheduler_operation *)0x0;
  sVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel_timer(queue,timer,&local_38,max_cancelled);
  if (bVar2) {
    if ((this->mutex_).enabled_ == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(this->mutex_).mutex_);
    }
    bVar2 = false;
  }
  scheduler::post_deferred_completions(this->scheduler_,&local_38);
  op_queue<asio::detail::scheduler_operation>::~op_queue(&local_38);
  if (bVar2) {
    pthread_mutex_unlock((pthread_mutex_t *)&(this->mutex_).mutex_);
  }
  return sVar1;
}

Assistant:

std::size_t epoll_reactor::cancel_timer(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data& timer,
    std::size_t max_cancelled)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  std::size_t n = queue.cancel_timer(timer, ops, max_cancelled);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
  return n;
}